

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

void __thiscall Graph::Graph(Graph *this,uint64_t n,uint64_t m)

{
  unsigned_long uVar1;
  ulong uVar2;
  vector<unsigned_long,std::allocator<unsigned_long>> *pvVar3;
  ulong uVar4;
  iterator iVar5;
  pointer pEVar6;
  ulong uVar7;
  iterator iVar8;
  long lVar9;
  bool bVar10;
  double dVar11;
  uint64_t index;
  uint64_t u;
  uniform_int_distribution<unsigned_long> vertex;
  uniform_int_distribution<unsigned_long> randomVertex;
  unordered_set<Graph::LightEdge,_std::hash<Graph::LightEdge>,_std::equal_to<Graph::LightEdge>,_std::allocator<Graph::LightEdge>_>
  helper;
  unsigned_long local_d8;
  ulong local_d0;
  ulong local_c8;
  uint64_t local_c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_b0;
  vector<Graph::Edge,_std::allocator<Graph::Edge>_> *local_a8;
  vector<Graph::Colors,_std::allocator<Graph::Colors>_> *local_a0;
  key_type local_98;
  uniform_int_distribution<unsigned_long> local_88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_78;
  uint64_t local_70;
  _Hashtable<Graph::LightEdge,_Graph::LightEdge,_std::allocator<Graph::LightEdge>,_std::__detail::_Identity,_std::equal_to<Graph::LightEdge>,_std::hash<Graph::LightEdge>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&this->matrix,n,(allocator_type *)&local_68);
  local_a8 = &this->edges;
  local_68._M_element_count = 0;
  local_68._M_buckets = (__buckets_ptr)0x0;
  local_68._M_bucket_count = 0;
  local_68._M_before_begin._M_nxt = local_68._M_before_begin._M_nxt & 0xffffffffffffff00;
  local_c0 = m;
  std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::vector
            (local_a8,m,(value_type *)&local_68,(allocator_type *)&local_88);
  local_68._M_buckets = (__buckets_ptr)((ulong)local_68._M_buckets & 0xffffffff00000000);
  std::vector<Graph::Colors,_std::allocator<Graph::Colors>_>::vector
            (&this->colorMap,n,(value_type *)&local_68,(allocator_type *)&local_88);
  local_b0 = &this->sums;
  local_68._M_buckets = (__buckets_ptr)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (local_b0,n,(value_type_conflict *)&local_68,(allocator_type *)&local_88);
  local_b8 = &this->time_discover;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (local_b8,n,(allocator_type *)&local_68);
  local_78 = &this->time_minimal;
  local_a0 = &this->colorMap;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (local_78,n,(allocator_type *)&local_68);
  (this->bridges).super__Vector_base<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bridges).super__Vector_base<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bridges).super__Vector_base<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar4 = n - 1;
  local_88._M_param._M_a = 0;
  local_d8 = 0;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  dVar11 = (((double)CONCAT44(0x45300000,(int)(local_c0 >> 0x20)) - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)local_c0) - 4503599627370496.0)) * 2.2;
  uVar7 = (ulong)dVar11;
  local_88._M_param._M_b = uVar4;
  local_70 = n;
  std::
  _Hashtable<Graph::LightEdge,_Graph::LightEdge,_std::allocator<Graph::LightEdge>,_std::__detail::_Identity,_std::equal_to<Graph::LightEdge>,_std::hash<Graph::LightEdge>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::rehash(&local_68,(long)(dVar11 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7);
  local_d0 = 1;
  if (uVar4 != 0) {
    uVar7 = 0;
    do {
      local_98.u = 0;
      local_98.v = uVar7;
      local_c8 = std::uniform_int_distribution<unsigned_long>::operator()
                           ((uniform_int_distribution<unsigned_long> *)&local_98,&engine,
                            (param_type *)&local_98);
      std::
      _Hashtable<Graph::LightEdge,Graph::LightEdge,std::allocator<Graph::LightEdge>,std::__detail::_Identity,std::equal_to<Graph::LightEdge>,std::hash<Graph::LightEdge>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_M_emplace<unsigned_long&,unsigned_long&>
                ((_Hashtable<Graph::LightEdge,Graph::LightEdge,std::allocator<Graph::LightEdge>,std::__detail::_Identity,std::equal_to<Graph::LightEdge>,std::hash<Graph::LightEdge>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&local_68,&local_c8,&local_d0);
      std::
      _Hashtable<Graph::LightEdge,Graph::LightEdge,std::allocator<Graph::LightEdge>,std::__detail::_Identity,std::equal_to<Graph::LightEdge>,std::hash<Graph::LightEdge>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_M_emplace<unsigned_long&,unsigned_long&>
                ((_Hashtable<Graph::LightEdge,Graph::LightEdge,std::allocator<Graph::LightEdge>,std::__detail::_Identity,std::equal_to<Graph::LightEdge>,std::hash<Graph::LightEdge>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&local_68,&local_d0,&local_c8);
      pvVar3 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
               ((this->matrix).
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + local_c8);
      iVar5._M_current = *(unsigned_long **)(pvVar3 + 8);
      if (iVar5._M_current == *(unsigned_long **)(pvVar3 + 0x10)) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>(pvVar3,iVar5,&local_d8);
      }
      else {
        *iVar5._M_current = local_d8;
        *(unsigned_long **)(pvVar3 + 8) = iVar5._M_current + 1;
      }
      pvVar3 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
               ((this->matrix).
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + local_d0);
      iVar5._M_current = *(unsigned_long **)(pvVar3 + 8);
      if (iVar5._M_current == *(unsigned_long **)(pvVar3 + 0x10)) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>(pvVar3,iVar5,&local_d8);
      }
      else {
        *iVar5._M_current = local_d8;
        *(unsigned_long **)(pvVar3 + 8) = iVar5._M_current + 1;
      }
      pEVar6 = (local_a8->super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pEVar6[local_d8].super_LightEdge.v = local_d0;
      uVar1 = local_d8 + 1;
      pEVar6[local_d8].super_LightEdge.u = local_c8;
      uVar2 = local_d0 + 1;
      uVar7 = local_d0;
      local_d8 = uVar1;
      local_d0 = uVar2;
    } while (uVar2 <= uVar4);
  }
  local_c0 = local_c0 - local_70;
  if (local_c0 != -1) {
    lVar9 = 0;
    do {
      do {
        local_c8 = std::uniform_int_distribution<unsigned_long>::operator()
                             (&local_88,&engine,&local_88._M_param);
        local_d0 = std::uniform_int_distribution<unsigned_long>::operator()
                             (&local_88,&engine,&local_88._M_param);
        local_98.u = local_c8;
        local_98.v = local_d0;
        iVar8 = std::
                _Hashtable<Graph::LightEdge,_Graph::LightEdge,_std::allocator<Graph::LightEdge>,_std::__detail::_Identity,_std::equal_to<Graph::LightEdge>,_std::hash<Graph::LightEdge>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(&local_68,&local_98);
        if (iVar8.super__Node_iterator_base<Graph::LightEdge,_true>._M_cur != (__node_type *)0x0) {
          local_c8 = local_d0;
        }
      } while (local_c8 == local_d0);
      std::
      _Hashtable<Graph::LightEdge,Graph::LightEdge,std::allocator<Graph::LightEdge>,std::__detail::_Identity,std::equal_to<Graph::LightEdge>,std::hash<Graph::LightEdge>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_M_emplace<unsigned_long&,unsigned_long&>
                ((_Hashtable<Graph::LightEdge,Graph::LightEdge,std::allocator<Graph::LightEdge>,std::__detail::_Identity,std::equal_to<Graph::LightEdge>,std::hash<Graph::LightEdge>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&local_68,&local_c8,&local_d0);
      std::
      _Hashtable<Graph::LightEdge,Graph::LightEdge,std::allocator<Graph::LightEdge>,std::__detail::_Identity,std::equal_to<Graph::LightEdge>,std::hash<Graph::LightEdge>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_M_emplace<unsigned_long&,unsigned_long&>
                ((_Hashtable<Graph::LightEdge,Graph::LightEdge,std::allocator<Graph::LightEdge>,std::__detail::_Identity,std::equal_to<Graph::LightEdge>,std::hash<Graph::LightEdge>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&local_68,&local_d0,&local_c8);
      pvVar3 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
               ((this->matrix).
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + local_c8);
      iVar5._M_current = *(unsigned_long **)(pvVar3 + 8);
      if (iVar5._M_current == *(unsigned_long **)(pvVar3 + 0x10)) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>(pvVar3,iVar5,&local_d8);
      }
      else {
        *iVar5._M_current = local_d8;
        *(unsigned_long **)(pvVar3 + 8) = iVar5._M_current + 1;
      }
      pvVar3 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
               ((this->matrix).
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + local_d0);
      iVar5._M_current = *(unsigned_long **)(pvVar3 + 8);
      if (iVar5._M_current == *(unsigned_long **)(pvVar3 + 0x10)) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>(pvVar3,iVar5,&local_d8);
      }
      else {
        *iVar5._M_current = local_d8;
        *(unsigned_long **)(pvVar3 + 8) = iVar5._M_current + 1;
      }
      pEVar6 = (local_a8->super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pEVar6[local_d8].super_LightEdge.v = local_d0;
      uVar1 = local_d8 + 1;
      pEVar6[local_d8].super_LightEdge.u = local_c8;
      bVar10 = lVar9 != local_c0;
      lVar9 = lVar9 + 1;
      local_d8 = uVar1;
    } while (bVar10);
  }
  std::
  _Hashtable<Graph::LightEdge,_Graph::LightEdge,_std::allocator<Graph::LightEdge>,_std::__detail::_Identity,_std::equal_to<Graph::LightEdge>,_std::hash<Graph::LightEdge>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

Graph::Graph(std::uint64_t n, std::uint64_t m)
    : matrix(n), edges(m, Edge(0, 0, false, 0)), colorMap(n, Colors::White),
      sums(n, 0), time_discover(n), time_minimal(n) {
    std::uniform_int_distribution<std::uint64_t> randomVertex(0, n - 1);
    std::uint64_t u, v, index = 0;

    std::unordered_set<LightEdge> helper;
    helper.reserve(2.2 * m);

    auto addEdge = [&]() {
        helper.emplace(u, v);
        helper.emplace(v, u);
        matrix[u].push_back(index);
        matrix[v].push_back(index);
        edges[index].v = v;
        edges[index++].u = u;
    };

    for (v = 1; v <= n - 1; ++v) {
        std::uniform_int_distribution<std::uint64_t> vertex(0, v - 1);
        u = vertex(engine);
        addEdge();
    }

    for (std::uint64_t i = 0; i < m - n + 1; ++i) {
        do {
            u = randomVertex(engine);
            v = randomVertex(engine);
            auto it = helper.find(LightEdge{u, v});
            if (it != helper.end())
                u = v;
        } while (u == v);

        addEdge();
    }
}